

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O2

vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_> *
__thiscall
program_options::command_line_parser::run_impl
          (vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
           *__return_storage_ptr__,command_line_parser *this)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  ulong uVar7;
  style_t sVar8;
  uint uVar9;
  uint uVar10;
  option_description *poVar11;
  ulong uVar12;
  too_many_positional_options_error *this_00;
  byte bVar13;
  pointer pbVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  byte bVar18;
  uint uVar19;
  pointer pbVar20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  e;
  vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  style_parsers;
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  result2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  pointer local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_58;
  undefined2 local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  style_parsers.
  super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  style_parsers.
  super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  style_parsers.
  super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar8 = this->m_style;
  if ((sVar8 & allow_long) != 0) {
    result2.
    super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    result2.
    super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:86:21)>
                  ::_M_manager;
    result2.
    super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
    std::
    vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
    ::
    emplace_back<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>
              ((vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
                *)&style_parsers,
               (function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&result2);
    std::_Function_base::~_Function_base((_Function_base *)&result2);
    sVar8 = this->m_style;
  }
  if ((sVar8 >> 0xc & 1) != 0) {
    result2.
    super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    result2.
    super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:93:21)>
                  ::_M_manager;
    result2.
    super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
    std::
    vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
    ::
    emplace_back<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>
              ((vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
                *)&style_parsers,
               (function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&result2);
    std::_Function_base::~_Function_base((_Function_base *)&result2);
    sVar8 = this->m_style;
  }
  if ((~sVar8 & 6) == 0) {
    result2.
    super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    result2.
    super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:100:21)>
                  ::_M_manager;
    result2.
    super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
    std::
    vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
    ::
    emplace_back<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>
              ((vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
                *)&style_parsers,
               (function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&result2);
    std::_Function_base::~_Function_base((_Function_base *)&result2);
    sVar8 = this->m_style;
  }
  if ((~sVar8 & 10) == 0) {
    result2.
    super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    result2.
    super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:107:21)>
                  ::_M_manager;
    result2.
    super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
    std::
    vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
    ::
    emplace_back<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>
              ((vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
                *)&style_parsers,
               (function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&result2);
    std::_Function_base::~_Function_base((_Function_base *)&result2);
  }
  result2.
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result2.
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:113:17)>
                ::_M_manager;
  result2.
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
  std::
  vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
  ::
  emplace_back<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>
            ((vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
              *)&style_parsers,
             (function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&result2);
  std::_Function_base::~_Function_base((_Function_base *)&result2);
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    if ((this->m_rawArguments).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->m_rawArguments).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      result2.
      super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      result2.
      super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      result2.
      super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar12 = 0;
      do {
        iVar15 = (int)uVar12;
        pbVar5 = (__return_storage_ptr__->
                 super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar6 = (__return_storage_ptr__->
                 super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if ((ulong)(((long)pbVar6 - (long)pbVar5) / 0x60) <= uVar12) {
          pbVar14 = (__return_storage_ptr__->
                    super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage;
          (__return_storage_ptr__->
          super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          )._M_impl.super__Vector_impl_data._M_start =
               result2.
               super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          (__return_storage_ptr__->
          super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          )._M_impl.super__Vector_impl_data._M_finish =
               result2.
               super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (__return_storage_ptr__->
          super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage =
               result2.
               super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          uVar12 = ((long)result2.
                          super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)result2.
                         super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x60;
          iVar15 = 0;
          for (uVar19 = 0; uVar17 = (ulong)uVar19, uVar17 < uVar12; uVar19 = uVar19 + 1) {
            if (result2.
                super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar17].string_key._M_string_length == 0)
            {
              result2.
              super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar17].position_key = iVar15;
              iVar15 = iVar15 + 1;
            }
          }
          pbVar20 = result2.
                    super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          result2.
          super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar14;
          if (this->m_positional_options_description != (positional_options_description *)0x0) {
            uVar9 = 0;
            uVar19 = 0;
            pbVar14 = result2.
                      super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            result2.
            super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
            ._M_impl.super__Vector_impl_data._M_start = pbVar5;
            result2.
            super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
            while( true ) {
              uVar17 = (ulong)uVar19;
              uVar12 = ((long)pbVar14 - (long)pbVar20) / 0x60;
              pbVar5 = result2.
                       super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pbVar6 = result2.
                       super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (uVar12 <= uVar17) break;
              if (pbVar20[uVar17].position_key != -1) {
                uVar10 = positional_options_description::max_total_count
                                   (this->m_positional_options_description);
                if (uVar10 <= uVar9) {
                  this_00 = (too_many_positional_options_error *)__cxa_allocate_exception(0x10);
                  too_many_positional_options_error::too_many_positional_options_error(this_00);
                  __cxa_throw(this_00,&too_many_positional_options_error::typeinfo,
                              std::logic_error::~logic_error);
                }
                positional_options_description::name_for_position_abi_cxx11_
                          (this->m_positional_options_description,uVar9);
                std::__cxx11::string::_M_assign((string *)(pbVar20 + uVar17));
                uVar9 = uVar9 + 1;
                pbVar20 = (__return_storage_ptr__->
                          super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                pbVar14 = (__return_storage_ptr__->
                          super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              }
              uVar19 = uVar19 + 1;
            }
          }
          result2.
          super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
          result2.
          super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pbVar5;
          sVar8 = this->m_style;
          bVar13 = (byte)(sVar8 >> 10);
          for (uVar19 = 0; uVar17 = (ulong)uVar19, uVar17 < uVar12; uVar19 = uVar19 + 1) {
            uVar7 = pbVar20[uVar17].string_key._M_string_length;
            bVar18 = bVar13;
            if ((uVar7 < 3) &&
               ((uVar7 != 2 || (*pbVar20[uVar17].string_key._M_dataplus._M_p == '-')))) {
              bVar18 = (byte)(sVar8 >> 0xb);
            }
            pbVar20[uVar17].case_insensitive = (bool)(bVar18 & 1);
          }
          std::
          vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ::~vector(&result2);
          std::
          vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
          ::~vector(&style_parsers);
          return __return_storage_ptr__;
        }
        std::
        vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
        ::push_back(&result2,pbVar5 + uVar12);
        pbVar5 = result2.
                 super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (result2.
            super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].string_key._M_string_length != 0) {
          sVar8 = this->m_style;
          poVar11 = options_description::find_nothrow
                              (this->m_options_description,
                               &result2.
                                super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1].string_key,
                               (bool)((byte)(sVar8 >> 9) & 1),(bool)((byte)(sVar8 >> 10) & 1),
                               (bool)((byte)(sVar8 >> 0xb) & 1));
          if (poVar11 != (option_description *)0x0) {
            option_description::semantic((option_description *)&e);
            uVar19 = (**(code **)(((e.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                                 0x18))();
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &e.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
            option_description::semantic((option_description *)&e);
            uVar9 = (**(code **)(((e.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                                0x20))();
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &e.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
            if ((uVar19 < uVar9) &&
               (uVar17 = (long)pbVar5[-1].value.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)pbVar5[-1].value.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5, uVar17 < uVar9)) {
              local_38 = &pbVar5[-1].value;
              for (iVar16 = (int)uVar17 - uVar9; iVar15 = (int)uVar12, iVar16 != 0;
                  iVar16 = iVar16 + 1) {
                uVar12 = (ulong)(iVar15 + 1U);
                pbVar6 = (__return_storage_ptr__->
                         super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                if ((((ulong)(((long)(__return_storage_ptr__->
                                     super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6) /
                             0x60) <= uVar12) || (pbVar6[uVar12].string_key._M_string_length != 0))
                   || (pbVar6[uVar12].position_key == 0x7fffffff)) break;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(local_38,pbVar6[uVar12].value.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&pbVar5[-1].original_tokens,
                            pbVar6[uVar12].original_tokens.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
                uVar12 = (ulong)(iVar15 + 1U);
              }
            }
          }
        }
        uVar12 = (ulong)(iVar15 + 1);
      } while( true );
    }
    uVar12 = 0;
    do {
      if ((ulong)((long)style_parsers.
                        super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)style_parsers.
                        super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar12) {
        result2.
        super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&result2.
                       super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        result2.
        super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        result2.
        super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)result2.
                              super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
        vStack_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_60 = (pointer)0x0;
        vStack_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_70._0_8_ = 0;
        local_70._8_8_ = 0;
        local_40._0_1_ = false;
        local_40._1_1_ = false;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_70,
                    (this->m_rawArguments).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&vStack_58,
                    (this->m_rawArguments).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
        std::
        vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&result2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase(&this->m_rawArguments,
                (this->m_rawArguments).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start);
        basic_option<char>::~basic_option((basic_option<char> *)&result2);
        break;
      }
      pbVar1 = (this->m_rawArguments).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar2 = (this->m_rawArguments).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
      ::operator()(&result2,style_parsers.
                            super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar12,&this->m_rawArguments
                  );
      if (result2.
          super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          result2.
          super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        e.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        e.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        e.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (uVar19 = 0;
            (ulong)uVar19 <
            ((long)result2.
                   super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)result2.
                  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x60 - 1U; uVar19 = uVar19 + 1) {
          finish_option(this,result2.
                             super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar19,&e,&style_parsers);
        }
        finish_option(this,result2.
                           super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1,&this->m_rawArguments,
                      &style_parsers);
        for (uVar19 = 0;
            (ulong)uVar19 <
            (ulong)(((long)result2.
                           super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)result2.
                          super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x60); uVar19 = uVar19 + 1) {
          std::
          vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ::push_back(__return_storage_ptr__,
                      result2.
                      super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar19);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&e);
      }
      pbVar3 = (this->m_rawArguments).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar4 = (this->m_rawArguments).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
      ::~vector(&result2);
      uVar12 = (ulong)((int)uVar12 + 1);
    } while ((long)pbVar3 - (long)pbVar4 >> 5 ==
             ((ulong)((long)pbVar1 - (long)pbVar2) >> 5 & 0xffffffff));
  } while( true );
}

Assistant:

std::vector<option> command_line_parser::run_impl()
{
    using namespace command_line_style;
    // The parsing is done by having a set of 'style parsers'
    // and trying then in order. Each parser is passed a vector
    // of unparsed tokens and can consume some of them (by
    // removing elements on front) and return a vector of options.
    //
    // We try each style parser in turn, untill some input
    // is consumed. The returned vector of option may contain the
    // result of just syntactic parsing of token, say --foo will
    // be parsed as option with name 'foo', and the style parser
    // is not required to care if that option is defined, and how
    // many tokens the value may take.
    // So, after vector is returned, we validate them.
    assert(m_options_description);

    std::vector<style_parser> style_parsers;

    //if (m_style_parser)
    //    style_parsers.push_back(m_style_parser);

    //if (m_additional_parser) {
    //    style_parsers.push_back([this] (std::vector<std::string>& args) {
    //        return this->handle_additional_parser(args);
    //    });
    //}

    if (m_style & allow_long) {
        style_parsers.push_back(
                    [this] (std::vector<std::string>& args) {
            return this->parse_long_option(args);
        });
    }

    if ((m_style & allow_long_disguise)) {
        style_parsers.push_back(
                    [this] (std::vector<std::string>& args) {
            return this->parse_disguised_long_option(args);
        });
    }

    if ((m_style & allow_short) && (m_style & allow_dash_for_short)) {
        style_parsers.push_back(
                    [this] (std::vector<std::string>& args) {
            return this->parse_short_option(args);
        });
    }

    if ((m_style & allow_short) && (m_style & allow_slash_for_short)) {
        style_parsers.push_back(
                    [this] (std::vector<std::string>& args) {
            return this->parse_dos_option(args);
        });
    }

    style_parsers.push_back(
                [this](std::vector<std::string>& args) {
        return parse_terminator(args);
    });

    std::vector<option> result;
    std::vector<std::string>& args = m_rawArguments;

    while(!args.empty())
    {
        bool ok = false;
        for(unsigned i = 0; i < style_parsers.size(); ++i)
        {
            unsigned current_size = static_cast<unsigned>(args.size());
            std::vector<option> next = style_parsers[i](args);

            // Check that option names
            // are valid, and that all values are in place.
            if (!next.empty())
            {
                std::vector<std::string> e;
                for(unsigned k = 0; k < next.size()-1; ++k) {
                    finish_option(next[k], e, style_parsers);
                }
                // For the last option, pass the unparsed tokens
                // so that they can be added to next.back()'s values
                // if appropriate.
                finish_option(next.back(), args, style_parsers);
                for (unsigned j = 0; j < next.size(); ++j)
                    result.push_back(next[j]);
            }

            if (args.size() != current_size) {
                ok = true;
                break;
            }
        }

        if (!ok) {
            option opt;
            opt.value.push_back(args[0]);
            opt.original_tokens.push_back(args[0]);
            result.push_back(opt);
            args.erase(args.begin());
        }
    }

    /* If an key option is followed by a positional option,
       can can consume more tokens (e.g. it's multitoken option),
       give those tokens to it.  */
    std::vector<option> result2;
    for (unsigned i = 0; i < result.size(); ++i)
    {
        result2.push_back(result[i]);
        option& opt = result2.back();

        if (opt.string_key.empty())
            continue;

        const option_description* xd = nullptr;
        try
        {
            xd = m_options_description->find_nothrow(opt.string_key,
                is_style_active(allow_guessing),
                is_style_active(long_case_insensitive),
                is_style_active(short_case_insensitive));
        }
        catch(error_with_option_name& e)
        {
            // add context and rethrow
            e.add_context(opt.string_key, opt.original_tokens[0], get_canonical_option_prefix());
            throw;
        }

        if (!xd)
            continue;

        unsigned min_tokens = xd->semantic()->min_tokens();
        unsigned max_tokens = xd->semantic()->max_tokens();
        if (min_tokens < max_tokens && opt.value.size() < max_tokens)
        {
            // This option may grab some more tokens.
            // We only allow to grab tokens that are not already
            // recognized as key options.

            int can_take_more = max_tokens - static_cast<int>(opt.value.size());
            unsigned j = i+1;
            for (; can_take_more && j < result.size(); --can_take_more, ++j)
            {
                option& opt2 = result[j];
                if (!opt2.string_key.empty())
                    break;

                if (opt2.position_key == INT_MAX)
                {
                    // We use INT_MAX to mark positional options that
                    // were found after the '--' terminator and therefore
                    // should stay positional forever.
                    break;
                }

                assert(opt2.value.size() == 1);

                opt.value.push_back(opt2.value[0]);

                assert(opt2.original_tokens.size() == 1);

                opt.original_tokens.push_back(opt2.original_tokens[0]);
            }
            i = j-1;
        }
    }
    result.swap(result2);


    // Assign position keys to positional options.
    int position_key = 0;
    for(unsigned i = 0; i < result.size(); ++i) {
        if (result[i].string_key.empty())
            result[i].position_key = position_key++;
    }

    if (m_positional_options_description)
    {
        unsigned position = 0;
        for (unsigned i = 0; i < result.size(); ++i) {
            option& opt = result[i];
            if (opt.position_key != -1) {
                if (position >= m_positional_options_description->max_total_count())
                {
                    throw too_many_positional_options_error();
                }
                opt.string_key = m_positional_options_description->name_for_position(position);
                ++position;
            }
        }
    }

    // set case sensitive flag
    for (unsigned i = 0; i < result.size(); ++i) {
        if (result[i].string_key.size() > 2 ||
                (result[i].string_key.size() > 1 && result[i].string_key[0] != '-'))
        {
            // it is a long option
            result[i].case_insensitive = is_style_active(long_case_insensitive);
        }
        else
        {
            // it is a short option
            result[i].case_insensitive = is_style_active(short_case_insensitive);
        }
    }

    return result;
}